

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

uint32_t cpu_ldl_data_ra_sparc64(CPUArchState_conflict19 *env,target_ulong ptr,uintptr_t retaddr)

{
  uint64_t uVar1;
  TCGMemOpIdx oi;
  
  oi = 0xa5;
  if (((env->lsu & 8) != 0) &&
     (((((env->def).features & 0x800) == 0 || ((env->hpstate & 4) == 0)) &&
      (oi = 0xa4, env->tl == 0)))) {
    oi = env->pstate >> 1 & 2 | 0xa0;
  }
  uVar1 = load_helper(env,ptr,oi,retaddr,MO_BEUL,false,full_be_ldul_mmu);
  return (uint32_t)uVar1;
}

Assistant:

uint32_t cpu_ldl_data_ra(CPUArchState *env, target_ulong ptr, uintptr_t retaddr)
{
    return cpu_ldl_mmuidx_ra(env, ptr, cpu_mmu_index(env, false), retaddr);
}